

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O3

bool __thiscall
binlog::SessionWriter::addEvent<boost::scoped_ptr<bool>,boost::shared_ptr<int>&>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,scoped_ptr<bool> *args,
          shared_ptr<int> *args_1)

{
  ulong minQueueCapacity;
  Queue *pQVar1;
  void *result;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar6._0_4_ = -(uint)((int)args->px == 0);
  auVar6._4_4_ = -(uint)((int)((ulong)args->px >> 0x20) == 0);
  auVar6._8_4_ = -(uint)((int)args_1->px == 0);
  auVar6._12_4_ = -(uint)((int)((ulong)args_1->px >> 0x20) == 0);
  auVar5._4_4_ = auVar6._0_4_;
  auVar5._0_4_ = auVar6._4_4_;
  auVar5._8_4_ = auVar6._12_4_;
  auVar5._12_4_ = auVar6._8_4_;
  auVar6 = auVar5 & auVar6 & _DAT_00115090 | ~(auVar5 & auVar6) & _DAT_001150a0;
  lVar4 = auVar6._8_8_ + auVar6._0_8_;
  minQueueCapacity = lVar4 + 4;
  if ((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity) {
    sVar2 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw);
    if (((sVar2 < minQueueCapacity) &&
        (replaceChannel(this,minQueueCapacity),
        (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity)) &&
       (sVar2 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw), sVar2 < minQueueCapacity)) {
      return false;
    }
  }
  *(int *)(this->_qw)._writePos = (int)lVar4;
  pcVar3 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar3 + 4;
  *(uint64_t *)(pcVar3 + 4) = eventSourceId;
  pcVar3 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar3 + 8;
  *(uint64_t *)(pcVar3 + 8) = clock;
  pcVar3 = (this->_qw)._writePos + 8;
  (this->_qw)._writePos = pcVar3;
  if (args->px == (bool *)0x0) {
    *pcVar3 = '\0';
  }
  else {
    *pcVar3 = '\x01';
    pcVar3 = (this->_qw)._writePos;
    (this->_qw)._writePos = pcVar3 + 1;
    pcVar3[1] = *args->px;
  }
  pcVar3 = (this->_qw)._writePos + 1;
  (this->_qw)._writePos = pcVar3;
  if (args_1->px == (element_type *)0x0) {
    *pcVar3 = '\0';
    lVar4 = 1;
  }
  else {
    *pcVar3 = '\x01';
    pcVar3 = (this->_qw)._writePos;
    (this->_qw)._writePos = pcVar3 + 1;
    *(element_type *)(pcVar3 + 1) = *args_1->px;
    lVar4 = 4;
  }
  pcVar3 = (this->_qw)._writePos + lVar4;
  (this->_qw)._writePos = pcVar3;
  pQVar1 = (this->_qw)._queue;
  (pQVar1->writeIndex).super___atomic_base<unsigned_long>._M_i = (long)pcVar3 - (long)pQVar1->buffer
  ;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}